

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O0

void envy_bios_print_xpiodir(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_xpiodir *peVar1;
  int local_2c;
  int i;
  envy_bios_xpiodir *xpiodir;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar1 = &(bios->gpio).xpiodir;
  if (peVar1->offset != 0) {
    if ((bios->gpio).xpiodir.valid == '\0') {
      fprintf((FILE *)out,"Failed to parse XPIODIR table at 0x%04x version %d.%d\n\n",
              (ulong)peVar1->offset,(ulong)(uint)((int)(uint)(bios->gpio).xpiodir.version >> 4),
              (ulong)((bios->gpio).xpiodir.version & 0xf));
    }
    else {
      fprintf((FILE *)out,"XPIODIR table at 0x%04x version %d.%d, %d subtables\n",
              (ulong)peVar1->offset,(ulong)(uint)((int)(uint)(bios->gpio).xpiodir.version >> 4),
              (ulong)((bios->gpio).xpiodir.version & 0xf),(ulong)(bios->gpio).xpiodir.entriesnum);
      envy_bios_dump_hex(bios,out,(uint)peVar1->offset,
                         (uint)(bios->gpio).xpiodir.hlen +
                         (uint)(bios->gpio).xpiodir.entriesnum * (uint)(bios->gpio).xpiodir.rlen,
                         mask);
      fprintf((FILE *)out,"\n");
      for (local_2c = 0; local_2c < (int)(uint)(bios->gpio).xpiodir.entriesnum;
          local_2c = local_2c + 1) {
        envy_bios_print_xpio(bios,out,(bios->gpio).xpiodir.entries + local_2c,local_2c,mask);
      }
    }
  }
  return;
}

Assistant:

void envy_bios_print_xpiodir (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_xpiodir *xpiodir = &bios->gpio.xpiodir;
	if (!xpiodir->offset)
		return;
	if (!xpiodir->valid) {
		fprintf(out, "Failed to parse XPIODIR table at 0x%04x version %d.%d\n\n", xpiodir->offset, xpiodir->version >> 4, xpiodir->version & 0xf);
		return;
	}
	fprintf(out, "XPIODIR table at 0x%04x version %d.%d, %d subtables\n", xpiodir->offset, xpiodir->version >> 4, xpiodir->version & 0xf, xpiodir->entriesnum);
	envy_bios_dump_hex(bios, out, xpiodir->offset, xpiodir->hlen + xpiodir->entriesnum * xpiodir->rlen, mask);
	fprintf(out, "\n");
	int i;
	for (i = 0; i < xpiodir->entriesnum; i++)
		envy_bios_print_xpio(bios, out, &xpiodir->entries[i], i, mask);
}